

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O2

void emitter_table_row(emitter_t *emitter,emitter_row_t *row)

{
  emitter_col_t *peVar1;
  
  if (emitter->output == emitter_output_table) {
    peVar1 = (row->cols).qlh_first;
    while (peVar1 != (emitter_col_t *)0x0) {
      emitter_print_value(emitter,peVar1->justify,peVar1->width,peVar1->type,&peVar1->field_3);
      peVar1 = (peVar1->link).qre_next;
      if (peVar1 == (row->cols).qlh_first) {
        peVar1 = (emitter_col_t *)0x0;
      }
    }
    emitter_table_printf(emitter,anon_var_dwarf_4b0ff16 + 8);
    return;
  }
  return;
}

Assistant:

static inline void
emitter_table_row(emitter_t *emitter, emitter_row_t *row) {
	if (emitter->output != emitter_output_table) {
		return;
	}
	emitter_col_t *col;
	ql_foreach(col, &row->cols, link) {
		emitter_print_value(emitter, col->justify, col->width,
		    col->type, (const void *)&col->bool_val);
	}
	emitter_table_printf(emitter, "\n");
}